

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumnsSet *pIVar1;
  ImGuiColumnData *pIVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  if (pIVar1 == (ImGuiColumnsSet *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3210,"float ImGui::GetColumnWidth(int)");
  }
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  if (column_index + 1 < (pIVar1->Columns).Size) {
    pIVar2 = (pIVar1->Columns).Data;
    return (pIVar1->MaxX - pIVar1->MinX) *
           (pIVar2[column_index + 1].OffsetNorm - pIVar2[column_index].OffsetNorm);
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4c0,
                "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    return OffsetNormToPixels(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}